

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

UModelIndex * __thiscall
TreeModel::findLastParentOfType
          (UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index,UINT8 type)

{
  UModelIndex lastParentOfType;
  UModelIndex local_58;
  UModelIndex local_40;
  
  if (((-1 < index->r) && (-1 < index->c)) && (index->m != (TreeModel *)0x0)) {
    findParentOfType(&local_58,this,index,type);
    if (((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) && (local_58.m != (TreeModel *)0x0)) {
      findParentOfType(&local_40,this,&local_58,type);
      if (((-1 < local_40.r) && (-1 < local_40.c)) && (local_40.m != (TreeModel *)0x0)) {
        do {
          local_58.m = local_40.m;
          local_58._0_8_ = CONCAT44(local_40.c,local_40.r);
          local_58.i = local_40.i;
          findParentOfType(&local_40,this,&local_58,type);
          if ((local_40.r < 0) || (local_40.c < 0)) break;
        } while (local_40.m != (TreeModel *)0x0);
      }
      __return_storage_ptr__->m = local_58.m;
      __return_storage_ptr__->r = local_58.r;
      __return_storage_ptr__->c = local_58.c;
      __return_storage_ptr__->i = local_58.i;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (TreeModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::findLastParentOfType(const UModelIndex& index, UINT8 type) const
{
    if (!index.isValid())
        return UModelIndex();
    
    UModelIndex lastParentOfType = findParentOfType(index, type);
    
    if (!lastParentOfType.isValid())
        return UModelIndex();
    
    UModelIndex currentParentOfType = findParentOfType(lastParentOfType, type);
    while (currentParentOfType.isValid()) {
        lastParentOfType = currentParentOfType;
        currentParentOfType = findParentOfType(lastParentOfType, type);
    }
    
    return lastParentOfType;
}